

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetGenexEvalNode::Evaluate
          (string *__return_storage_ptr__,TargetGenexEvalNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  byte bVar1;
  byte bVar2;
  cmLocalGenerator *lg;
  GeneratorExpressionContent *pGVar3;
  bool bVar4;
  ulong uVar5;
  cmGeneratorTarget *headTarget;
  ostream *poVar6;
  allocator<char> local_431;
  string local_430;
  string local_410;
  cmListFileBacktrace local_3f0;
  string local_3e0;
  undefined1 local_3c0 [8];
  cmGeneratorExpressionContext targetContext;
  string *expression;
  string local_238;
  ostringstream local_218 [8];
  ostringstream e;
  cmGeneratorTarget *target;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string *local_40;
  string *targetName;
  cmGeneratorExpressionDAGChecker *dagCheckerParent_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetGenexEvalNode *this_local;
  
  targetName = (string *)dagCheckerParent;
  dagCheckerParent_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (TargetGenexEvalNode *)__return_storage_ptr__;
  local_40 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(parameters);
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) != 0) || (bVar4 = cmGeneratorExpression::IsValidTargetName(local_40), !bVar4)) {
    pGVar3 = content_local;
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "$<TARGET_GENEX_EVAL:tgt, ...> expression requires a non-empty valid target name.",
               &local_81);
    reportError((cmGeneratorExpressionContext *)pGVar3,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  headTarget = cmLocalGenerator::FindGeneratorTargetToUse
                         ((cmLocalGenerator *)
                          content_local[3].ParamChildren.
                          super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,local_40);
  if (headTarget == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_218);
    poVar6 = std::operator<<((ostream *)local_218,"$<TARGET_GENEX_EVAL:tgt, ...> target \"");
    poVar6 = std::operator<<(poVar6,(string *)local_40);
    std::operator<<(poVar6,"\" not found.");
    pGVar3 = content_local;
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_238,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::__cxx11::ostringstream::str();
    reportError((cmGeneratorExpressionContext *)pGVar3,&local_238,(string *)&expression);
    std::__cxx11::string::~string((string *)&expression);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::ostringstream::~ostringstream(local_218);
    return __return_storage_ptr__;
  }
  targetContext._344_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)context_local,1);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    lg = (cmLocalGenerator *)
         content_local[3].ParamChildren.
         super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::string
              ((string *)&local_3e0,
               (string *)
               &content_local[3].ParamChildren.
                super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = *(byte *)&content_local[4].StartContent;
    bVar2 = *(byte *)((long)&content_local[4].StartContent + 4);
    cmListFileBacktrace::cmListFileBacktrace(&local_3f0,(cmListFileBacktrace *)content_local);
    std::__cxx11::string::string
              ((string *)&local_410,(string *)&content_local[4].IdentifierChildren);
    cmGeneratorExpressionContext::cmGeneratorExpressionContext
              ((cmGeneratorExpressionContext *)local_3c0,lg,&local_3e0,(bool)(bVar1 & 1),headTarget,
               headTarget,(bool)(bVar2 & 1),&local_3f0,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    cmListFileBacktrace::~cmListFileBacktrace(&local_3f0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"TARGET_GENEX_EVAL",&local_431);
    GenexEvaluator::EvaluateExpression
              (__return_storage_ptr__,&this->super_GenexEvaluator,&local_430,
               (string *)targetContext._344_8_,(cmGeneratorExpressionContext *)local_3c0,
               (GeneratorExpressionContent *)dagCheckerParent_local,
               (cmGeneratorExpressionDAGChecker *)targetName);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    cmGeneratorExpressionContext::~cmGeneratorExpressionContext
              ((cmGeneratorExpressionContext *)local_3c0);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)targetContext._344_8_);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    const std::string& targetName = parameters.front();
    if (targetName.empty() ||
        !cmGeneratorExpression::IsValidTargetName(targetName)) {
      reportError(context, content->GetOriginalExpression(),
                  "$<TARGET_GENEX_EVAL:tgt, ...> expression requires a "
                  "non-empty valid target name.");
      return std::string();
    }

    const auto* target = context->LG->FindGeneratorTargetToUse(targetName);
    if (!target) {
      std::ostringstream e;
      e << "$<TARGET_GENEX_EVAL:tgt, ...> target \"" << targetName
        << "\" not found.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }

    const std::string& expression = parameters[1];
    if (expression.empty()) {
      return expression;
    }

    cmGeneratorExpressionContext targetContext(
      context->LG, context->Config, context->Quiet, target, target,
      context->EvaluateForBuildsystem, context->Backtrace, context->Language);

    return this->EvaluateExpression("TARGET_GENEX_EVAL", expression,
                                    &targetContext, content, dagCheckerParent);
  }